

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
AnalyzeFunctionDefinition
          (ExpressionContext *ctx,SynFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *instance,TypeBase *instanceParent,IntrusiveList<MatchData> matches,
          bool createAccess,bool hideFunction,bool checkParent)

{
  bool bVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  ExprFunctionDefinition *definition_00;
  ExprFunctionDefinition *definition;
  ExprBase *value;
  TypeBase *returnType;
  TypeBase *currentType;
  TypeBase *parentType;
  bool checkParent_local;
  bool hideFunction_local;
  bool createAccess_local;
  TypeBase *instanceParent_local;
  TypeFunction *instance_local;
  FunctionData *genericProto_local;
  SynFunctionDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  currentType = (TypeBase *)0x0;
  pTVar3 = instanceParent;
  if ((instanceParent == (TypeBase *)0x0) &&
     (pTVar3 = currentType, syntax->parentType != (SynBase *)0x0)) {
    currentType = AnalyzeType(ctx,syntax->parentType,true,(bool *)0x0);
    bVar1 = isType<TypeError>(currentType);
    if (bVar1) {
      currentType = (TypeBase *)0x0;
    }
    pTVar3 = currentType;
    if (((currentType != (TypeBase *)0x0) && (checkParent)) &&
       (pTVar2 = ExpressionContext::GetCurrentType(ctx,ctx->scope), pTVar2 != (TypeBase *)0x0)) {
      if (currentType == pTVar2) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,syntax->parentType,
                   "ERROR: class name repeated inside the definition of class");
      }
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: cannot define class \'%.*s\' function inside the scope of class \'%.*s\'",
                 (ulong)(uint)((int)(currentType->name).end - (int)(currentType->name).begin),
                 (currentType->name).begin,
                 (ulong)(uint)((int)(pTVar2->name).end - (int)(pTVar2->name).begin),
                 (pTVar2->name).begin);
    }
  }
  currentType = pTVar3;
  if ((currentType == (TypeBase *)0x0) ||
     (((bVar1 = isType<TypeGeneric>(currentType), !bVar1 &&
       (bVar1 = isType<TypeGenericAlias>(currentType), !bVar1)) &&
      ((bVar1 = isType<TypeAuto>(currentType), !bVar1 &&
       (bVar1 = isType<TypeVoid>(currentType), !bVar1)))))) {
    pTVar3 = AnalyzeType(ctx,syntax->returnType,true,(bool *)0x0);
    if ((pTVar3->isGeneric & 1U) != 0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&syntax->super_SynBase,"ERROR: return type can\'t be generic");
    }
    if (((syntax->accessor & 1U) == 0) || (currentType != (TypeBase *)0x0)) {
      ctx_local = (ExpressionContext *)
                  CreateFunctionDefinition
                            (ctx,&syntax->super_SynBase,
                             (bool)((syntax->super_SynBase).field_0x3a & 1),
                             (bool)((syntax->super_SynBase).field_0x3b & 1),currentType,
                             (bool)(syntax->accessor & 1),pTVar3,(bool)(syntax->isOperator & 1),
                             syntax->name,syntax->aliases,syntax->arguments,syntax->expressions,
                             genericProto,instance,matches);
      definition_00 = getType<ExprFunctionDefinition>((ExprBase *)ctx_local);
      if ((definition_00 != (ExprFunctionDefinition *)0x0) &&
         ((definition_00->function->scope->ownerType == (TypeBase *)0x0 && (createAccess)))) {
        ctx_local = (ExpressionContext *)
                    CreateFunctionPointer(ctx,&syntax->super_SynBase,definition_00,hideFunction);
      }
    }
    else {
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
      pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError((ExprError *)ctx_local,&syntax->super_SynBase,pTVar3);
    }
  }
  else if ((syntax->accessor & 1U) == 0) {
    pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_8df1c::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar3,
                           "ERROR: cannot add member function to type \'%.*s\'",
                           (ulong)(uint)((int)(currentType->name).end -
                                        (int)(currentType->name).begin),(currentType->name).begin);
  }
  else {
    pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_8df1c::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar3,
                           "ERROR: cannot add accessor to type \'%.*s\'",
                           (ulong)(uint)((int)(currentType->name).end -
                                        (int)(currentType->name).begin),(currentType->name).begin);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeFunctionDefinition(ExpressionContext &ctx, SynFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *instance, TypeBase *instanceParent, IntrusiveList<MatchData> matches, bool createAccess, bool hideFunction, bool checkParent)
{
	TypeBase *parentType = NULL;

	if(instanceParent)
	{
		parentType = instanceParent;
	}
	else if(syntax->parentType)
	{
		parentType = AnalyzeType(ctx, syntax->parentType);

		if(isType<TypeError>(parentType))
			parentType = NULL;

		if(parentType && checkParent)
		{
			if(TypeBase *currentType = ctx.GetCurrentType(ctx.scope))
			{
				if(parentType == currentType)
					Stop(ctx, syntax->parentType, "ERROR: class name repeated inside the definition of class");

				Stop(ctx, syntax, "ERROR: cannot define class '%.*s' function inside the scope of class '%.*s'", FMT_ISTR(parentType->name), FMT_ISTR(currentType->name));
			}
		}
	}

	if(parentType && (isType<TypeGeneric>(parentType) || isType<TypeGenericAlias>(parentType) || isType<TypeAuto>(parentType) || isType<TypeVoid>(parentType)))
	{
		if(syntax->accessor)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add accessor to type '%.*s'", FMT_ISTR(parentType->name));

		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add member function to type '%.*s'", FMT_ISTR(parentType->name));
	}

	TypeBase *returnType = AnalyzeType(ctx, syntax->returnType);

	if(returnType->isGeneric)
		Stop(ctx, syntax, "ERROR: return type can't be generic");

	if(syntax->accessor && !parentType)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	ExprBase *value = CreateFunctionDefinition(ctx, syntax, syntax->prototype, syntax->coroutine, parentType, syntax->accessor, returnType, syntax->isOperator, syntax->name, syntax->aliases, syntax->arguments, syntax->expressions, genericProto, instance, matches);

	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
	{
		if(definition->function->scope->ownerType)
			return value;

		if(createAccess)
			return CreateFunctionPointer(ctx, syntax, definition, hideFunction);
	}

	return value;
}